

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::AssertionResult::operator<<(AssertionResult *this,IFile **value)

{
  string local_1d0;
  undefined1 local_1a0 [8];
  Message msg;
  IFile **value_local;
  AssertionResult *this_local;
  
  msg.m_stream.super_iu_stringstream._384_8_ = value;
  detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)local_1a0);
  detail::iuStreamMessage::operator<<
            ((iuStreamMessage *)local_1a0,(IFile **)msg.m_stream.super_iu_stringstream._384_8_);
  detail::iuStreamMessage::GetString_abi_cxx11_(&local_1d0,(iuStreamMessage *)local_1a0);
  std::__cxx11::string::operator+=((string *)this,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  detail::iuStreamMessage::~iuStreamMessage((iuStreamMessage *)local_1a0);
  return this;
}

Assistant:

AssertionResult& operator << (const T& value)
    {
        Message msg;
        msg << value;
        m_message += msg.GetString();
        return *this;
    }